

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

void __thiscall
acto::actor::handler<msg_ball,Player,msg_ball_const&>(actor *this,offset_in_Player_to_subr func)

{
  pointer *__ptr;
  _Head_base<0UL,_acto::actor::handler_t_*,_false> local_48;
  _Head_base<0UL,_acto::actor::mem_handler_t<msg_ball,_Player,_const_msg_ball_&>_*,_false> local_40;
  actor *local_38;
  type_index local_30;
  Player *local_28 [2];
  
  local_30._M_target = (type_info *)&msg_ball::typeinfo;
  local_38 = this;
  local_28[0] = (Player *)func;
  std::
  make_unique<acto::actor::mem_handler_t<msg_ball,Player,msg_ball_const&>,void(Player::*&)(acto::actor_ref,msg_ball_const&),Player*>
            ((offset_in_Player_to_subr *)&local_40,local_28);
  local_48._M_head_impl = &(local_40._M_head_impl)->super_handler_t;
  local_40._M_head_impl = (mem_handler_t<msg_ball,_Player,_const_msg_ball_&> *)0x0;
  set_handler(this,&local_30,
              (unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *)
              &local_48);
  if (local_48._M_head_impl != (handler_t *)0x0) {
    (*(local_48._M_head_impl)->_vptr_handler_t[1])();
  }
  local_48._M_head_impl = (handler_t *)0x0;
  std::
  unique_ptr<acto::actor::mem_handler_t<msg_ball,_Player,_const_msg_ball_&>,_std::default_delete<acto::actor::mem_handler_t<msg_ball,_Player,_const_msg_ball_&>_>_>
  ::~unique_ptr((unique_ptr<acto::actor::mem_handler_t<msg_ball,_Player,_const_msg_ball_&>,_std::default_delete<acto::actor::mem_handler_t<msg_ball,_Player,_const_msg_ball_&>_>_>
                 *)&local_40);
  return;
}

Assistant:

void handler(void (ClassName::*func)(actor_ref, P)) {
    set_handler(
      // Type of the handler.
      std::type_index(typeid(M)),
      // Callback.
      std::make_unique<mem_handler_t<M, ClassName, P>>(
        func, static_cast<ClassName*>(this)));
  }